

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

int ov_test(FILE *f,OggVorbis_File *vf,char *initial,long ibytes)

{
  ov_callbacks callbacks_00;
  int iVar1;
  ov_callbacks callbacks;
  long ibytes_local;
  char *initial_local;
  OggVorbis_File *vf_local;
  FILE *f_local;
  
  callbacks_00.seek_func = _fseek64_wrap;
  callbacks_00.read_func = fread;
  callbacks_00.close_func = fclose;
  callbacks_00.tell_func = ftell;
  iVar1 = ov_test_callbacks(f,vf,initial,ibytes,callbacks_00);
  return iVar1;
}

Assistant:

int ov_test(FILE *f,OggVorbis_File *vf,const char *initial,long ibytes){
  ov_callbacks callbacks = {
    (size_t (*)(void *, size_t, size_t, void *))  fread,
    (int (*)(void *, ogg_int64_t, int))              _fseek64_wrap,
    (int (*)(void *))                             fclose,
    (long (*)(void *))                            ftell
  };

  return ov_test_callbacks((void *)f, vf, initial, ibytes, callbacks);
}